

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::commit_in_bg(raft_server *this)

{
  ulong uVar1;
  element_type *peVar2;
  int iVar3;
  pthread_t __target_thread;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> lock2;
  string thread_name;
  unique_lock<std::mutex> local_80;
  undefined1 local_70 [16];
  char local_60 [16];
  char *local_50 [2];
  char local_40 [16];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"nuraft_commit","");
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,local_50[0]);
LAB_001cd3ac:
  do {
    if ((this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i <
        (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i) {
      uVar1 = (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
      iVar3 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      if (uVar1 < CONCAT44(extraout_var,iVar3) - 1U) {
        commit_in_bg_exec(this,0);
        goto LAB_001cd3ac;
      }
    }
    local_80._M_owns = false;
    local_80._M_device = &this->commit_cv_lock_;
    std::unique_lock<std::mutex>::lock(&local_80);
    local_80._M_owns = true;
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      iVar3 = (*peVar2->_vptr_logger[7])();
      if (5 < iVar3) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)local_70,"commit_cv_ sleep\n");
        (*peVar2->_vptr_logger[8])
                  (peVar2,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit_in_bg",0x7b,(string *)local_70);
        if ((char *)local_70._0_8_ != local_60) {
          operator_delete((void *)local_70._0_8_);
        }
      }
    }
    while (((this->stopping_)._M_base._M_i & 1U) == 0) {
      if (((this->sm_commit_paused_)._M_base._M_i & 1U) == 0) {
        iVar3 = (*((this->log_store_).
                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_log_store[2])();
        if (((this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i <
             CONCAT44(extraout_var_00,iVar3) - 1U) &&
           ((this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i <
            (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i)) break;
      }
      std::condition_variable::wait((unique_lock *)&this->commit_cv_);
    }
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      iVar3 = (*peVar2->_vptr_logger[7])();
      if (5 < iVar3) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)local_70,"commit_cv_ wake up\n");
        (*peVar2->_vptr_logger[8])
                  (peVar2,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit_in_bg",0x7e,(string *)local_70);
        if ((char *)local_70._0_8_ != local_60) {
          operator_delete((void *)local_70._0_8_);
        }
      }
    }
    if (((this->stopping_)._M_base._M_i & 1U) != 0) {
      std::unique_lock<std::mutex>::unlock(&local_80);
      local_80._M_device = (mutex_type *)0x0;
      local_80._M_owns = false;
      local_70._0_8_ = &this->ready_to_stop_cv_lock_;
      local_70[8] = false;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_70);
      local_70[8] = true;
      std::condition_variable::notify_all();
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_70);
      LOCK();
      (this->commit_bg_stopped_)._M_base._M_i = true;
      UNLOCK();
      std::unique_lock<std::mutex>::~unique_lock(&local_80);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      return;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_80);
  } while( true );
}

Assistant:

void raft_server::commit_in_bg() {
    std::string thread_name = "nuraft_commit";
#ifdef __linux__
    pthread_setname_np(pthread_self(), thread_name.c_str());
#elif __APPLE__
    pthread_setname_np(thread_name.c_str());
#endif

    while (true) {
     try {
        while ( quick_commit_index_ <= sm_commit_index_ ||
                sm_commit_index_ >= log_store_->next_slot() - 1 ) {
            std::unique_lock<std::mutex> lock(commit_cv_lock_);

            auto wait_check = [this]() {
                if (stopping_) {
                    // WARNING: `stopping_` flag should have the highest priority.
                    return true;
                }
                if (sm_commit_paused_) {
                    return false;
                }
                return ( log_store_->next_slot() - 1 > sm_commit_index_ &&
                         quick_commit_index_ > sm_commit_index_ );
            };
            p_tr("commit_cv_ sleep\n");
            commit_cv_.wait(lock, wait_check);

            p_tr("commit_cv_ wake up\n");
            if (stopping_) {
                lock.unlock();
                lock.release();
                { std::unique_lock<std::mutex> lock2(ready_to_stop_cv_lock_);
                  ready_to_stop_cv_.notify_all(); }
                commit_bg_stopped_ = true;
                return;
            }

            // NOTE:
            //   Even though commit_cv_ is invoked (by commit()), we don't
            //   need to execute it if the current commit index number of
            //   the state machine is greater than either
            //     1) requested commit index or
            //     2) log store's latest log index.
        }

        commit_in_bg_exec();

     } catch (std::exception& err) {
        // LCOV_EXCL_START
        commit_bg_stopped_ = true;
        p_er( "background committing thread encounter err %s, "
              "exiting to protect the system",
              err.what() );
        ctx_->state_mgr_->system_exit(raft_err::N20_background_commit_err);
        ::exit(-1);
        // LCOV_EXCL_STOP
     }
    }
    commit_bg_stopped_ = true;
}